

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

void text_client_argparse(t_text_client *x,int *argcp,t_atom **argvp,char *name)

{
  int iVar1;
  t_symbol *ptVar2;
  t_atom *local_38;
  t_atom *argv;
  int argc;
  char *name_local;
  t_atom **argvp_local;
  int *argcp_local;
  t_text_client *x_local;
  
  argv._4_4_ = *argcp;
  local_38 = *argvp;
  x->tc_field = (t_symbol *)0x0;
  x->tc_struct = (t_symbol *)0x0;
  x->tc_sym = (t_symbol *)0x0;
  gpointer_init(&x->tc_gp);
  if (((argv._4_4_ == 0) || (local_38->a_type != A_SYMBOL)) ||
     (iVar1 = strcmp(((local_38->a_w).w_symbol)->s_name,"-s"), iVar1 != 0)) {
    if ((argv._4_4_ != 0) && (local_38->a_type == A_SYMBOL)) {
      x->tc_sym = (t_symbol *)local_38->a_w;
      argv._4_4_ = argv._4_4_ + -1;
      local_38 = local_38 + 1;
    }
  }
  else if (((argv._4_4_ < 3) || (local_38[1].a_type != A_SYMBOL)) ||
          (local_38[2].a_type != A_SYMBOL)) {
    pd_error(x,"%s: \'-s\' needs a struct and field name",name);
  }
  else {
    ptVar2 = canvas_makebindsym(local_38[1].a_w.w_symbol);
    x->tc_struct = ptVar2;
    x->tc_field = (t_symbol *)local_38[2].a_w;
    argv._4_4_ = argv._4_4_ + -3;
    local_38 = local_38 + 3;
  }
  *argcp = argv._4_4_;
  *argvp = local_38;
  return;
}

Assistant:

static void text_client_argparse(t_text_client *x, int *argcp, t_atom **argvp,
    char *name)
{
    int argc = *argcp;
    t_atom *argv = *argvp;
    x->tc_sym = x->tc_struct = x->tc_field = 0;
    gpointer_init(&x->tc_gp);
    if (argc && argv->a_type == A_SYMBOL &&
        !strcmp(argv->a_w.w_symbol->s_name, "-s"))
    {
        if (argc < 3 || argv[1].a_type != A_SYMBOL ||
            argv[2].a_type != A_SYMBOL)
                pd_error(x, "%s: '-s' needs a struct and field name", name);
        else
        {
            x->tc_struct = canvas_makebindsym(argv[1].a_w.w_symbol);
            x->tc_field = argv[2].a_w.w_symbol;
            argc -= 3; argv += 3;
        }
    }
    else if (argc && argv->a_type == A_SYMBOL)
    {
        x->tc_sym = argv->a_w.w_symbol;
        argc--; argv++;
    }
    *argcp = argc;
    *argvp = argv;
}